

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O3

int IDABBDPrecReInitB(void *ida_mem,int which,sunindextype mudqB,sunindextype mldqB,
                     sunrealtype dq_rel_yyB)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar4 = -1;
    ida_mem = (IDAMem)0x0;
    error_code = -1;
    iVar2 = 0x335;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAAdjInit.";
    iVar4 = -0x65;
    error_code = -0x65;
    iVar2 = 0x33e;
  }
  else {
    if (which < *(int *)(*(long *)((long)ida_mem + 0x840) + 0x38)) {
      piVar3 = (int *)(*(long *)((long)ida_mem + 0x840) + 0x30);
      do {
        piVar1 = *(int **)piVar3;
        piVar3 = piVar1 + 0x20;
      } while (*piVar1 != which);
      iVar2 = IDABBDPrecReInit(*(void **)(piVar1 + 4),mudqB,mldqB,dq_rel_yyB);
      return iVar2;
    }
    msgfmt = "Illegal value for which.";
    iVar4 = -3;
    error_code = -3;
    iVar2 = 0x347;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDABBDPrecReInitB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_bbdpre.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDABBDPrecReInitB(void* ida_mem, int which, sunindextype mudqB,
                      sunindextype mldqB, sunrealtype dq_rel_yyB)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  void* ida_memB;
  int flag;

  /* Check if ida_mem is allright. */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDALS_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_WHICH);
    return (IDALS_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  /* ida_mem corresponding to 'which' backward problem. */
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* ReInitialize the BBD preconditioner for this backward problem. */
  flag = IDABBDPrecReInit(ida_memB, mudqB, mldqB, dq_rel_yyB);
  return (flag);
}